

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O3

SUNErrCode SUNAdaptController_Write_ImExGus(SUNAdaptController C,FILE *fptr)

{
  fwrite("ImEx Gustafsson SUNAdaptController module:\n",0x2b,1,(FILE *)fptr);
  fprintf((FILE *)fptr,"  k1e = %16g\n",*(undefined8 *)((long)C->content + 0x10));
  fprintf((FILE *)fptr,"  k2e = %16g\n",*(undefined8 *)((long)C->content + 0x18));
  fprintf((FILE *)fptr,"  k1i = %16g\n",*C->content);
  fprintf((FILE *)fptr,"  k2i = %16g\n",*(undefined8 *)((long)C->content + 8));
  fprintf((FILE *)fptr,"  bias factor = %16g\n",*(undefined8 *)((long)C->content + 0x20));
  fprintf((FILE *)fptr,"  previous error = %16g\n",*(undefined8 *)((long)C->content + 0x28));
  fprintf((FILE *)fptr,"  previous step = %16g\n",*(undefined8 *)((long)C->content + 0x30));
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Write_ImExGus(SUNAdaptController C, FILE* fptr)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(fptr, SUN_ERR_ARG_CORRUPT);
  fprintf(fptr, "ImEx Gustafsson SUNAdaptController module:\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  fprintf(fptr, "  k1e = %32Lg\n", SACIMEXGUS_K1E(C));
  fprintf(fptr, "  k2e = %32Lg\n", SACIMEXGUS_K2E(C));
  fprintf(fptr, "  k1i = %32Lg\n", SACIMEXGUS_K1I(C));
  fprintf(fptr, "  k2i = %32Lg\n", SACIMEXGUS_K2I(C));
  fprintf(fptr, "  bias factor = %22Lg\n", SACIMEXGUS_BIAS(C));
  fprintf(fptr, "  previous error = %22Lg\n", SACIMEXGUS_EP(C));
  fprintf(fptr, "  previous step = %22Lg\n", SACIMEXGUS_HP(C));
#else
  fprintf(fptr, "  k1e = %16g\n", SACIMEXGUS_K1E(C));
  fprintf(fptr, "  k2e = %16g\n", SACIMEXGUS_K2E(C));
  fprintf(fptr, "  k1i = %16g\n", SACIMEXGUS_K1I(C));
  fprintf(fptr, "  k2i = %16g\n", SACIMEXGUS_K2I(C));
  fprintf(fptr, "  bias factor = %16g\n", SACIMEXGUS_BIAS(C));
  fprintf(fptr, "  previous error = %16g\n", SACIMEXGUS_EP(C));
  fprintf(fptr, "  previous step = %16g\n", SACIMEXGUS_HP(C));
#endif
  return SUN_SUCCESS;
}